

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Tag::~Tag(Tag *this)

{
  void *in_RDI;
  
  ~Tag((Tag *)0x126628);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~Tag() = default;